

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_SimulateSop(Abc_Obj_t *pObj,char *pSop)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  if ((pSop == (char *)0x0) || (iVar4 = Abc_SopIsExorType(pSop), iVar4 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x1ba,"void Abc_FlowRetime_SimulateSop(Abc_Obj_t *, char *)");
  }
  iVar5 = Abc_SopGetVarNum(pSop);
  uVar10 = 0;
  iVar4 = 0;
  pbVar7 = (byte *)pSop;
  do {
    bVar1 = *pbVar7;
    if (bVar1 == 0) {
      iVar5 = 0;
      if (uVar10 == 0) {
        iVar5 = iVar4;
      }
      iVar4 = Abc_SopGetPhase(pSop);
      Abc_FlowRetime_SetInitValue(pObj,iVar4 == 0 ^ uVar10,iVar5);
      return;
    }
    lVar9 = 0;
    uVar8 = 1;
    bVar2 = false;
    while ((bVar1 & 0xdf) != 0) {
      if (bVar1 == 0x30) {
        iVar6 = 5;
LAB_0040e92d:
        if ((*(ushort *)
              (pManMR->pDataArray +
              *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar9]] + 0x10)) &
            0x60) == 0) {
          bVar2 = true;
        }
        else {
          uVar8 = uVar8 & (*(ushort *)
                            (pManMR->pDataArray +
                            *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar9]]
                                     + 0x10)) >> iVar6 & 1) != 0;
        }
      }
      else if (bVar1 == 0x31) {
        iVar6 = 6;
        goto LAB_0040e92d;
      }
      lVar3 = lVar9 + 1;
      lVar9 = lVar9 + 1;
      bVar1 = pbVar7[lVar3];
    }
    if (bVar2 && uVar8 != 0) {
      uVar8 = 0;
      iVar4 = 1;
    }
    uVar10 = uVar10 | uVar8;
    pbVar7 = pbVar7 + (iVar5 + 3);
  } while( true );
}

Assistant:

void Abc_FlowRetime_SimulateSop( Abc_Obj_t * pObj, char *pSop ) {
  Abc_Obj_t * pFanin;
  char *pCube;
  int i, j, rAnd, rOr, rVar, dcAnd, dcOr, v;

  assert( pSop && !Abc_SopIsExorType(pSop) );
      
  rOr = 0, dcOr = 0;

  i = Abc_SopGetVarNum(pSop);
  Abc_SopForEachCube( pSop, i, pCube ) {
    rAnd = 1, dcAnd = 0;
    Abc_CubeForEachVar( pCube, v, j ) {
      pFanin = Abc_ObjFanin(pObj, j);
      if ( v == '0' )
        rVar = FTEST(pFanin, INIT_0) ? 1 : 0;
      else if ( v == '1' )
        rVar = FTEST(pFanin, INIT_1) ? 1 : 0;
      else
        continue;
      
      if (FTEST(pFanin, INIT_CARE))
        rAnd &= rVar;
      else
        dcAnd = 1;
    }
    if (!rAnd) dcAnd = 0; /* controlling value */
    if (dcAnd) 
      dcOr = 1;
    else
      rOr |= rAnd;
  }
  if (rOr) dcOr = 0; /* controlling value */
  
  // complement the result if necessary
  if ( !Abc_SopGetPhase(pSop) )
    rOr ^= 1;
      
  Abc_FlowRetime_SetInitValue(pObj, rOr, dcOr);
}